

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

void opj_t1_dec_refpass_step_raw
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 poshalf,OPJ_UINT32 ci)

{
  byte bVar1;
  OPJ_UINT32 OVar2;
  int iVar3;
  
  bVar1 = (char)ci * '\x03';
  if ((0x200010 << (bVar1 & 0x1f) & *flagsp) == 0x10 << (bVar1 & 0x1f)) {
    OVar2 = opj_mqc_raw_decode(&t1->mqc);
    iVar3 = -poshalf;
    if (OVar2 != (uint)*datap >> 0x1f) {
      iVar3 = poshalf;
    }
    *datap = iVar3 + *datap;
    *flagsp = *flagsp | 0x100000 << (bVar1 & 0x1f);
  }
  return;
}

Assistant:

static INLINE void opj_t1_dec_refpass_step_raw(
    opj_t1_t *t1,
    opj_flag_t *flagsp,
    OPJ_INT32 *datap,
    OPJ_INT32 poshalf,
    OPJ_UINT32 ci)
{
    OPJ_UINT32 v;

    opj_mqc_t *mqc = &(t1->mqc);       /* RAW component */

    if ((*flagsp & ((T1_SIGMA_THIS | T1_PI_THIS) << (ci * 3U))) ==
            (T1_SIGMA_THIS << (ci * 3U))) {
        v = opj_mqc_raw_decode(mqc);
        *datap += (v ^ (*datap < 0)) ? poshalf : -poshalf;
        *flagsp |= T1_MU_THIS << (ci * 3U);
    }
}